

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

bool __thiscall cmake::SetDirectoriesFromFile(cmake *this,string *arg)

{
  cmState *this_00;
  size_type sVar1;
  size_type sVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  cmValue dir;
  string *psVar7;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string fullPath;
  string path;
  string cacheFile;
  string listPath;
  string cachePath;
  string listFile;
  string local_100;
  char *local_e0;
  undefined8 local_d8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  bVar3 = cmsys::SystemTools::FileIsDirectory(arg);
  if (bVar3) {
    cmsys::SystemTools::CollapseFullPath(&local_d0,arg);
    cmsys::SystemTools::ConvertToUnixSlashes(&local_d0);
    local_100._M_dataplus._M_p = (pointer)local_d0._M_string_length;
    local_100._M_string_length = (size_type)local_d0._M_dataplus._M_p;
    local_100.field_2._M_allocated_capacity = 0;
    local_100.field_2._8_8_ = 0xf;
    local_e0 = "/CMakeCache.txt";
    local_d8 = 0;
    views._M_len = 2;
    views._M_array = (iterator)&local_100;
    cmCatViews(&local_b0,views);
    local_100._M_dataplus._M_p = (pointer)local_d0._M_string_length;
    local_100._M_string_length = (size_type)local_d0._M_dataplus._M_p;
    local_100.field_2._M_allocated_capacity = 0;
    local_100.field_2._8_8_ = 0xf;
    local_e0 = "/CMakeLists.txt";
    local_d8 = 0;
    views_00._M_len = 2;
    views_00._M_array = (iterator)&local_100;
    cmCatViews(&local_50,views_00);
    bVar3 = cmsys::SystemTools::FileExists(&local_b0);
    if (bVar3) {
      std::__cxx11::string::_M_assign((string *)&local_70);
    }
    bVar4 = cmsys::SystemTools::FileExists(&local_50);
    if (bVar4) {
      bVar3 = true;
      std::__cxx11::string::_M_assign((string *)&local_90);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar3 = cmsys::SystemTools::FileExists(arg);
    if (bVar3) {
      cmsys::SystemTools::CollapseFullPath(&local_100,arg);
      cmsys::SystemTools::GetFilenameName(&local_d0,&local_100);
      cmsys::SystemTools::LowerCase(&local_b0,&local_d0);
      std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_string_length ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0xe) {
        if (*(long *)(local_d0._M_dataplus._M_p + 6) == 0x7478742e65686361 &&
            *(long *)local_d0._M_dataplus._M_p == 0x636163656b616d63) {
          cmsys::SystemTools::GetFilenamePath(&local_b0,&local_100);
          psVar7 = &local_70;
          goto LAB_003058a0;
        }
        if (*(long *)(local_d0._M_dataplus._M_p + 6) == 0x7478742e73747369 &&
            *(long *)local_d0._M_dataplus._M_p == 0x73696c656b616d63) {
          cmsys::SystemTools::GetFilenamePath(&local_b0,&local_100);
          goto LAB_00305882;
        }
      }
    }
    else {
      cmsys::SystemTools::CollapseFullPath(&local_100,arg);
      cmsys::SystemTools::GetFilenameName(&local_d0,&local_100);
      cmsys::SystemTools::LowerCase(&local_b0,&local_d0);
      std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_d0._M_string_length ==
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0xe) &&
         ((*(long *)(local_d0._M_dataplus._M_p + 6) == 0x7478742e65686361 &&
           *(long *)local_d0._M_dataplus._M_p == 0x636163656b616d63 ||
          (*(long *)(local_d0._M_dataplus._M_p + 6) == 0x7478742e73747369 &&
           *(long *)local_d0._M_dataplus._M_p == 0x73696c656b616d63)))) {
        cmsys::SystemTools::GetFilenamePath(&local_b0,&local_100);
LAB_00305882:
        psVar7 = &local_90;
LAB_003058a0:
        std::__cxx11::string::operator=((string *)psVar7,(string *)&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        std::__cxx11::string::_M_assign((string *)&local_90);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    bVar3 = true;
    bVar4 = false;
  }
  if ((local_70._M_string_length != 0) && (bVar5 = LoadCache(this,&local_70), bVar5)) {
    this_00 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
              super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
              super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"CMAKE_HOME_DIRECTORY","");
    dir = cmState::GetCacheEntryValue(this_00,&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if (dir.Value != (string *)0x0) {
      SetHomeOutputDirectory(this,&local_70);
      bVar5 = true;
      SetHomeDirectory(this,dir.Value);
      goto LAB_00305b78;
    }
  }
  psVar7 = cmState::GetSourceDirectory_abi_cxx11_
                     ((this->State)._M_t.
                      super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                      super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                      super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  sVar1 = psVar7->_M_string_length;
  psVar7 = cmState::GetBinaryDirectory_abi_cxx11_
                     ((this->State)._M_t.
                      super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                      super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                      super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  sVar2 = psVar7->_M_string_length;
  psVar7 = cmState::GetSourceDirectory_abi_cxx11_
                     ((this->State)._M_t.
                      super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                      super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                      super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  if (local_90._M_string_length == psVar7->_M_string_length) {
    if (local_90._M_string_length != 0) {
      iVar6 = bcmp(local_90._M_dataplus._M_p,(psVar7->_M_dataplus)._M_p,local_90._M_string_length);
      if (iVar6 != 0) goto LAB_003059ec;
      bVar5 = true;
      goto LAB_00305af0;
    }
LAB_00305a47:
    bVar5 = true;
LAB_00305a4d:
    if (sVar1 == 0) {
      cmsys::SystemTools::CollapseFullPath(&local_100,arg);
      SetHomeDirectory(this,&local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
LAB_00305aab:
      if (sVar2 == 0) {
        cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
        SetHomeOutputDirectory(this,&local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
        }
        bVar5 = false;
      }
      goto LAB_00305b78;
    }
    if (bVar3 != false || sVar2 != 0) goto LAB_00305aab;
    cmsys::SystemTools::CollapseFullPath(&local_100,arg);
    SetHomeOutputDirectory(this,&local_100);
  }
  else {
LAB_003059ec:
    psVar7 = cmState::GetBinaryDirectory_abi_cxx11_
                       ((this->State)._M_t.
                        super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                        super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                        super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
    if (local_90._M_string_length == psVar7->_M_string_length) {
      if (local_90._M_string_length == 0) goto LAB_00305a47;
      iVar6 = bcmp(local_90._M_dataplus._M_p,(psVar7->_M_dataplus)._M_p,local_90._M_string_length);
      bVar5 = (bool)(sVar2 == 0 | bVar4 | iVar6 == 0);
    }
    else {
      bVar5 = (bool)(sVar2 == 0 | bVar4);
      if (local_90._M_string_length == 0) goto LAB_00305a4d;
    }
LAB_00305af0:
    if (bVar4 == false) {
      if (sVar1 != 0 || sVar2 != 0) {
        if (sVar2 == 0) {
          SetHomeOutputDirectory(this,&local_90);
        }
        goto LAB_00305b78;
      }
      SetHomeDirectory(this,&local_90);
      cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
      SetHomeOutputDirectory(this,&local_100);
    }
    else {
      SetHomeDirectoryViaCommandLine(this,&local_90);
      if (sVar2 != 0) goto LAB_00305b78;
      cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
      SetHomeOutputDirectory(this,&local_100);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
LAB_00305b78:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  return bVar5;
}

Assistant:

bool cmake::SetDirectoriesFromFile(const std::string& arg)
{
  // Check if the argument refers to a CMakeCache.txt or
  // CMakeLists.txt file.
  std::string listPath;
  std::string cachePath;
  bool is_source_dir = false;
  bool is_empty_directory = false;
  if (cmSystemTools::FileIsDirectory(arg)) {
    std::string path = cmSystemTools::CollapseFullPath(arg);
    cmSystemTools::ConvertToUnixSlashes(path);
    std::string cacheFile = cmStrCat(path, "/CMakeCache.txt");
    std::string listFile = cmStrCat(path, "/CMakeLists.txt");

    is_empty_directory = true;
    if (cmSystemTools::FileExists(cacheFile)) {
      cachePath = path;
      is_empty_directory = false;
    }
    if (cmSystemTools::FileExists(listFile)) {
      listPath = path;
      is_empty_directory = false;
      is_source_dir = true;
    }
  } else if (cmSystemTools::FileExists(arg)) {
    std::string fullPath = cmSystemTools::CollapseFullPath(arg);
    std::string name = cmSystemTools::GetFilenameName(fullPath);
    name = cmSystemTools::LowerCase(name);
    if (name == "cmakecache.txt"_s) {
      cachePath = cmSystemTools::GetFilenamePath(fullPath);
    } else if (name == "cmakelists.txt"_s) {
      listPath = cmSystemTools::GetFilenamePath(fullPath);
    }
  } else {
    // Specified file or directory does not exist.  Try to set things
    // up to produce a meaningful error message.
    std::string fullPath = cmSystemTools::CollapseFullPath(arg);
    std::string name = cmSystemTools::GetFilenameName(fullPath);
    name = cmSystemTools::LowerCase(name);
    if (name == "cmakecache.txt"_s || name == "cmakelists.txt"_s) {
      listPath = cmSystemTools::GetFilenamePath(fullPath);
    } else {
      listPath = fullPath;
    }
  }

  // If there is a CMakeCache.txt file, use its settings.
  if (!cachePath.empty()) {
    if (this->LoadCache(cachePath)) {
      cmValue existingValue =
        this->State->GetCacheEntryValue("CMAKE_HOME_DIRECTORY");
      if (existingValue) {
        this->SetHomeOutputDirectory(cachePath);
        this->SetHomeDirectory(*existingValue);
        return true;
      }
    }
  }

  bool no_source_tree = this->GetHomeDirectory().empty();
  bool no_build_tree = this->GetHomeOutputDirectory().empty();

  // When invoked with a path that points to an existing CMakeCache
  // This function is called multiple times with the same path
  const bool passed_same_path = (listPath == this->GetHomeDirectory()) ||
    (listPath == this->GetHomeOutputDirectory());
  bool used_provided_path =
    (passed_same_path || is_source_dir || no_build_tree);

  // If there is a CMakeLists.txt file, use it as the source tree.
  if (!listPath.empty()) {
    // When invoked with a path that points to an existing CMakeCache
    // This function is called multiple times with the same path
    if (is_source_dir) {
      this->SetHomeDirectoryViaCommandLine(listPath);
      if (no_build_tree) {
        std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
        this->SetHomeOutputDirectory(cwd);
      }
    } else if (no_source_tree && no_build_tree) {
      this->SetHomeDirectory(listPath);

      std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
      this->SetHomeOutputDirectory(cwd);
    } else if (no_build_tree) {
      this->SetHomeOutputDirectory(listPath);
    }
  } else {
    if (no_source_tree) {
      // We didn't find a CMakeLists.txt and it wasn't specified
      // with -S. Assume it is the path to the source tree
      std::string full = cmSystemTools::CollapseFullPath(arg);
      this->SetHomeDirectory(full);
    }
    if (no_build_tree && !no_source_tree && is_empty_directory) {
      // passed `-S <path> <build_dir> when build_dir is an empty directory
      std::string full = cmSystemTools::CollapseFullPath(arg);
      this->SetHomeOutputDirectory(full);
    } else if (no_build_tree) {
      // We didn't find a CMakeCache.txt and it wasn't specified
      // with -B. Assume the current working directory as the build tree.
      std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
      this->SetHomeOutputDirectory(cwd);
      used_provided_path = false;
    }
  }

  return used_provided_path;
}